

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O3

void __thiscall leveldb::RecoveryTest::Open(RecoveryTest *this,Options *options)

{
  undefined1 local_1c8 [24];
  char *local_1b0;
  undefined4 local_1a8;
  stringstream local_1a0 [392];
  
  local_1c8[0x10] = '\x01';
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc";
  local_1a8 = 0x42;
  std::__cxx11::stringstream::stringstream(local_1a0);
  OpenWithStatus((RecoveryTest *)local_1c8,(Options *)this);
  test::Tester::IsOk((Tester *)(local_1c8 + 0x10),(Status *)local_1c8);
  if ((void *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != (void *)0x0) {
    operator_delete__((void *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_));
  }
  test::Tester::~Tester((Tester *)(local_1c8 + 0x10));
  local_1c8[0x10] = '\x01';
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc";
  local_1a8 = 0x43;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1c8._0_4_ = 1;
  local_1c8._12_4_ = NumLogs(this);
  test::Tester::IsEq<int,int>
            ((Tester *)(local_1c8 + 0x10),(int *)local_1c8,(int *)(local_1c8 + 0xc));
  test::Tester::~Tester((Tester *)(local_1c8 + 0x10));
  return;
}

Assistant:

void Open(Options* options = nullptr) {
    ASSERT_OK(OpenWithStatus(options));
    ASSERT_EQ(1, NumLogs());
  }